

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8b46::ARTKeyEncodeDecodeTest_EncodeTextC0014_Test::TestBody
          (ARTKeyEncodeDecodeTest_EncodeTextC0014_Test *this)

{
  bool in_CL;
  anon_unknown_dwarf_8b46 local_128 [8];
  key_encoder enc;
  
  enc.ibuf._248_8_ = local_128;
  enc.buf = &DAT_00000100;
  enc.cap = 0;
  do_pad_test_large_string
            ((anon_unknown_dwarf_8b46 *)enc.ibuf._248_8_,(key_encoder *)0xfffd,1,in_CL);
  if (&DAT_00000100 < enc.buf) {
    free((void *)enc.ibuf._248_8_);
  }
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, EncodeTextC0014) {
  unodb::key_encoder enc;
  do_pad_test_large_string(enc, unodb::key_encoder::maxlen + 1, true);
}